

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSpatialStructureElementType::IfcSpatialStructureElementType
          (IfcSpatialStructureElementType *this,void **vtt)

{
  void *pvVar1;
  
  IfcElementType::IfcElementType(&this->super_IfcElementType,vtt + 1);
  pvVar1 = vtt[0x1f];
  *(void **)&(this->super_IfcElementType).field_0x180 = pvVar1;
  *(void **)(&(this->super_IfcElementType).field_0x180 + *(long *)((long)pvVar1 + -0x18)) =
       vtt[0x20];
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject = pvVar1;
  *(void **)(&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x21];
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x88 =
       vtt[0x22];
  (this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x23];
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 =
       vtt[0x24];
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x148 = vtt[0x25];
  *(void **)&(this->super_IfcElementType).field_0x180 = vtt[0x26];
  return;
}

Assistant:

IfcSpatialStructureElementType() : Object("IfcSpatialStructureElementType") {}